

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O2

bool __thiscall pybind11::function::is_cpp_function(function *this)

{
  undefined1 uVar1;
  handle ob;
  int iVar2;
  
  ob = detail::get_function((this->super_object).super_handle.m_ptr);
  if (ob.m_ptr == (PyObject *)0x0) {
    uVar1 = 0;
  }
  else {
    iVar2 = _PyObject_TypeCheck(ob.m_ptr,(PyTypeObject *)&PyCFunction_Type);
    uVar1 = (undefined1)iVar2;
  }
  return (bool)uVar1;
}

Assistant:

bool is_cpp_function() const {
        handle fun = detail::get_function(m_ptr);
        return fun && PyCFunction_Check(fun.ptr());
    }